

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall
LLVMBC::ExtractValueInst::ExtractValueInst
          (ExtractValueInst *this,Type *type,Value *aggregate,Vector<unsigned_int> *indices_)

{
  pointer ptr;
  pointer puVar1;
  pointer ppVVar2;
  
  Value::Value((Value *)this,type,ExtractValue);
  (this->super_Instruction).is_terminator = false;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Instruction).attachments._M_h._M_buckets =
       &(this->super_Instruction).attachments._M_h._M_single_bucket;
  (this->super_Instruction).attachments._M_h._M_bucket_count = 1;
  (this->super_Instruction).attachments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_Instruction).attachments._M_h._M_element_count = 0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Instruction).attachments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (indices_->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->indices).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->indices).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->indices).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVVar2 = (pointer)::dxil_spv::allocate_in_thread(8);
  *ppVVar2 = aggregate;
  ptr = (this->super_Instruction).operands.
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppVVar2;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar2 + 1;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppVVar2 + 1;
  if (ptr != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr);
    return;
  }
  return;
}

Assistant:

ExtractValueInst::ExtractValueInst(Type *type, Value *aggregate, Vector<unsigned> indices_)
    : Instruction(type, ValueKind::ExtractValue)
    , indices(std::move(indices_))
{
	set_operands({ aggregate });
}